

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

prsndef * prsxbin(prscxdef *ctx,prsbdef *binctx)

{
  int iVar1;
  long lVar2;
  prsndef *n1;
  int *piVar3;
  long lVar4;
  prsndef *n2;
  int t;
  
  n1 = (*binctx->prsblf)(ctx,binctx->prsbctx);
  do {
    t = (ctx->prscxtok->tokcxcur).toktyp;
    piVar3 = binctx->prsblst;
    do {
      iVar1 = *piVar3;
      if (iVar1 == 0) break;
      piVar3 = piVar3 + 1;
    } while (iVar1 != t);
    if (iVar1 != t) {
      return n1;
    }
    if ((ctx->prscxflg & 4) != 0) {
      lVar2 = -4;
      do {
        lVar4 = lVar2;
        iVar1 = *(int *)((long)prsxbin::ambig_ops + lVar4 + 4);
        if (iVar1 == 0) break;
        lVar2 = lVar4 + 4;
      } while (iVar1 != t);
      if (iVar1 != 0) {
        ctx->prscxerr->errcxptr->erraav[0].errastr =
             (char *)((long)&prsxbin_ambig_names_rel + (long)*(int *)(&UNK_0013a378 + lVar4));
        ctx->prscxerr->errcxptr->erraac = 1;
        errlogn(ctx->prscxerr,0x165,"TADS");
        return n1;
      }
    }
    toknext(ctx->prscxtok);
    if ((ctx->prscxtok->tokcxflg & 4) != 0) {
      if (t == 7) {
        t = 0x9e;
      }
      else if (t == 0xd0) {
        t = 7;
      }
    }
    n2 = (*binctx->prsbrf)(ctx,binctx->prsbctx);
    n1 = prsnew2(ctx,t,n1,n2);
    if (binctx->prsbrpt == 0) {
      return n1;
    }
  } while( true );
}

Assistant:

static prsndef *prsxbin(prscxdef *ctx, prsbdef *binctx)
{
    prsndef *n;
    int      t;
    int     *lp;
    
    n = (*binctx->prsblf)(ctx, binctx->prsbctx);
    do
    {
        t = ctx->prscxtok->tokcxcur.toktyp;
        for (lp = binctx->prsblst ; *lp && *lp != t ; ++lp) ;
        if (*lp == t)
        {
            /*
             *   if inside a list, check to see if this is a binary
             *   operator that can also server as a unary operator -- if
             *   so, interpret it as a unary operator and warn about it 
             */
            if (ctx->prscxflg & PRSCXFLST)
            {
                static int ambig_ops[] = { TOKTBAND, TOKTPLUS, TOKTMINUS, 0 };
                static char *ambig_names[] = { "&", "+", "-" };

                for (lp = ambig_ops ; *lp && *lp != t ; ++lp) ;
                if (*lp)
                {
                    errlog1(ctx->prscxerr, ERR_AMBIGBIN,
                            ERRTSTR, ambig_names[lp - ambig_ops]);
                    break;
                }
            }

            /* skip the operator */
            toknext(ctx->prscxtok);

            /* use C-style operators if in C mode */
            if (prs_cmode(ctx))
            {
                switch(t)
                {
                case TOKTEQEQ:
                    t = TOKTEQ;
                    break;

                case TOKTEQ:
                    t = TOKTASSIGN;
                    break;
                }
            }

            /* generate a node for the binary operator */
            n = prsnew2(ctx, t, n, (*binctx->prsbrf)(ctx, binctx->prsbctx));
        }
        else
            break;
    } while (binctx->prsbrpt);
    
    return(n);
}